

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

bool google::protobuf::internal::IsFieldTypeEligibleForFastParsing(FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  CppStringType CVar3;
  int iVar4;
  OneofDescriptor *pOVar5;
  FieldOptions *this;
  CppStringType ctype;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_map(field);
  if ((!bVar1) &&
     (pOVar5 = FieldDescriptor::real_containing_oneof(field), pOVar5 == (OneofDescriptor *)0x0)) {
    this = FieldDescriptor::options(field);
    bVar1 = FieldOptions::weak(this);
    if (!bVar1) {
      TVar2 = FieldDescriptor::type(field);
      if ((((TVar2 == TYPE_STRING) || (TVar2 == TYPE_BYTES)) &&
          (CVar3 = FieldDescriptor::cpp_string_type(field), CVar3 != kString)) && (CVar3 != kView))
      {
        if (CVar3 != kCord) {
          return false;
        }
        bVar1 = FieldDescriptor::is_repeated(field);
        if (bVar1) {
          return false;
        }
      }
      iVar4 = FieldDescriptor::number(field);
      if (0x7ff < iVar4) {
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool IsFieldTypeEligibleForFastParsing(const FieldDescriptor* field) {
  // Map, oneof, weak, and split fields are not handled on the fast path.
  if (field->is_map() || field->real_containing_oneof() ||
      field->options().weak()) {
    return false;
  }

  switch (field->type()) {
      // Some bytes fields can be handled on fast path.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      auto ctype = field->cpp_string_type();
      if (ctype == FieldDescriptor::CppStringType::kString ||
          ctype == FieldDescriptor::CppStringType::kView) {
        // strings are fine...
      } else if (ctype == FieldDescriptor::CppStringType::kCord) {
        // Cords are worth putting into the fast table, if they're not repeated
        if (field->is_repeated()) return false;
      } else {
        return false;
      }
      break;
    }

    default:
      break;
  }

  // The largest tag that can be read by the tailcall parser is two bytes
  // when varint-coded. This allows 14 bits for the numeric tag value:
  //   byte 0   byte 1
  //   1nnnnttt 0nnnnnnn
  //    ^^^^^^^  ^^^^^^^
  if (field->number() >= 1 << 11) return false;

  return true;
}